

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

int libssh2_poll_channel_read(LIBSSH2_CHANNEL *channel,int extended)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  list_node *node;
  int iVar4;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    iVar4 = -0x27;
  }
  else {
    for (node = (list_node *)_libssh2_list_first(&channel->session->packets); iVar4 = 0,
        node != (list_node *)0x0; node = (list_node *)_libssh2_list_next(node)) {
      uVar1 = (channel->local).id;
      uVar3 = _libssh2_ntohu32((uchar *)((long)&(node[1].next)->next + 1));
      if (uVar1 == uVar3) {
        if (extended == 0) {
          bVar2 = *(byte *)&(node[1].next)->next;
        }
        else {
          if (extended != 1) goto LAB_0011afe6;
          bVar2 = *(byte *)&(node[1].next)->next & 0xfe;
        }
        if (bVar2 == 0x5e) {
          return 1;
        }
      }
LAB_0011afe6:
    }
  }
  return iVar4;
}

Assistant:

LIBSSH2_API int
libssh2_poll_channel_read(LIBSSH2_CHANNEL *channel, int extended)
{
    LIBSSH2_SESSION *session;
    LIBSSH2_PACKET *packet;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    session = channel->session;
    packet = _libssh2_list_first(&session->packets);

    while (packet) {
        if ( channel->local.id == _libssh2_ntohu32(packet->data + 1)) {
            if ( extended == 1 &&
                 (packet->data[0] == SSH_MSG_CHANNEL_EXTENDED_DATA
                  || packet->data[0] == SSH_MSG_CHANNEL_DATA )) {
                return 1;
            } else if ( extended == 0 &&
                        packet->data[0] == SSH_MSG_CHANNEL_DATA) {
                return 1;
            }
            /* else - no data of any type is ready to be read */
        }
        packet = _libssh2_list_next(&packet->node);
    }

    return 0;
}